

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::UBOToSSBOInvertCase::iterate(UBOToSSBOInvertCase *this)

{
  uint *puVar1;
  size_type *this_00;
  deUint32 *this_01;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLuint index;
  GLenum GVar5;
  char *pcVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestError *pTVar8;
  ulong uVar9;
  deUint32 ndx;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  allocator<char> local_4fd;
  uint local_4fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  BufferMemMap bufMap;
  Buffer outputBuffer;
  Buffer inputBuffer;
  BufferMemMap bufMap_1;
  InterfaceBlockInfo blockInfo;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  ShaderProgram program;
  Random rnd;
  uint local_2f0;
  uint local_2ec;
  int local_2e8;
  ostringstream src;
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  poVar7 = std::operator<<((ostream *)&src,pcVar6);
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"layout (local_size_x = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->m_localSize).m_data[0]);
  poVar7 = std::operator<<(poVar7,", local_size_y = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->m_localSize).m_data[1]);
  poVar7 = std::operator<<(poVar7,", local_size_z = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->m_localSize).m_data[2]);
  poVar7 = std::operator<<(poVar7,") in;\n");
  poVar7 = std::operator<<(poVar7,"uniform Input {\n");
  poVar7 = std::operator<<(poVar7,"    uint values[");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_numValues);
  poVar7 = std::operator<<(poVar7,"];\n");
  poVar7 = std::operator<<(poVar7,"} ub_in;\n");
  poVar7 = std::operator<<(poVar7,"layout(binding = 1) buffer Output {\n");
  poVar7 = std::operator<<(poVar7,"    uint values[");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_numValues);
  poVar7 = std::operator<<(poVar7,"];\n");
  poVar7 = std::operator<<(poVar7,"} sb_out;\n");
  poVar7 = std::operator<<(poVar7,"void main (void) {\n");
  poVar7 = std::operator<<(poVar7,
                           "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar7 = std::operator<<(poVar7,
                           "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar7 = std::operator<<(poVar7,
                           "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                          );
  poVar7 = std::operator<<(poVar7,"    uint offset          = numValuesPerInv*groupNdx;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar7 = std::operator<<(poVar7,
                           "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n");
  std::operator<<(poVar7,"}\n");
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&rnd,0,0xac);
  std::__cxx11::stringbuf::str();
  this_00 = &blockInfo.name._M_string_length;
  blockInfo.name._M_dataplus._M_p._0_4_ = 5;
  std::__cxx11::string::string((string *)this_00,(string *)&bufMap);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&rnd,(ShaderSource *)&blockInfo);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&bufMap);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&rnd);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&inputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&inputValues,(long)this->m_numValues,(allocator_type *)&rnd);
  deRandom_init(&rnd.m_rnd,0x111223f);
  for (lVar13 = 0;
      lVar13 < (int)((ulong)((long)inputValues.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)inputValues.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      lVar13 = lVar13 + 1) {
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar13] = dVar3;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0xa8);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = &rnd.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"Work groups: ");
  tcu::operator<<((ostream *)this_01,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  (*gl->useProgram)(program.m_program.m_program);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e2,"Input");
  glu::getProgramInterfaceBlockInfo(&blockInfo,gl,program.m_program.m_program,0x92e2,GVar4);
  index = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e1,"Input.values");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&rnd,gl,program.m_program.m_program,0x92e1,index);
  (*gl->bindBuffer)(0x8a11,inputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x8a11,(ulong)blockInfo.dataSize,(void *)0x0,0x88e4);
  BufferMemMap::BufferMemMap(&bufMap,gl,0x8a11,0,blockInfo.dataSize,2);
  uVar9 = (ulong)((long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar10 = 0;
  while( true ) {
    uVar12 = (ulong)local_2f0;
    if ((uint)uVar9 <= local_2f0) {
      uVar12 = uVar9 & 0xffffffff;
    }
    if (uVar12 <= uVar10) break;
    *(uint *)((long)bufMap.m_ptr + (ulong)(uint)(local_2e8 * (int)uVar10) + (ulong)local_2ec) =
         inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar10];
    uVar10 = uVar10 + 1;
  }
  BufferMemMap::~BufferMemMap(&bufMap);
  (*gl->uniformBlockBinding)(program.m_program.m_program,GVar4,0);
  (*gl->bindBufferBase)(0x8a11,0,inputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Input buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xc1);
  std::__cxx11::string::~string((string *)&rnd);
  glu::InterfaceBlockInfo::~InterfaceBlockInfo(&blockInfo);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar3 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar4,0x9303);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar3,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,1,outputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xcc);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xd1);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar3 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar4,0x9303);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Output.values");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&rnd,gl,program.m_program.m_program,0x92e5,GVar4);
  BufferMemMap::BufferMemMap(&bufMap_1,gl,0x90d2,0,dVar3,1);
  if (local_2f0 ==
      (uint)((ulong)((long)inputValues.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)inputValues.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2)) {
    uVar11 = 0;
    uVar9 = 0;
    do {
      local_4fc = (uint)uVar9;
      if (local_2f0 == uVar9) {
        BufferMemMap::~BufferMemMap(&bufMap_1);
        std::__cxx11::string::~string((string *)&rnd);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&inputBuffer.super_ObjectWrapper);
        glu::ShaderProgram::~ShaderProgram(&program);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
        return STOP;
      }
      uVar10 = (ulong)uVar11;
      puVar1 = inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9;
      uVar9 = uVar9 + 1;
      uVar11 = uVar11 + local_2e8;
    } while ((*puVar1 ^ *(uint *)((long)bufMap_1.m_ptr + uVar10 + local_2ec)) == 0xffffffff);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"Comparison failed for Output.values[",&local_4fd);
    de::toString<unsigned_int>(&local_430,&local_4fc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufMap,
                   &local_410,&local_430);
    std::operator+(&blockInfo.name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufMap,"]")
    ;
    tcu::TestError::TestError(pTVar8,&blockInfo.name);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0xdb);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "uniform Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} ub_in;\n"
			<< "layout(binding = 1) buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		std::vector<deUint32>		inputValues		(m_numValues);

		// Compute input values.
		{
			de::Random rnd(0x111223f);
			for (int ndx = 0; ndx < (int)inputValues.size(); ndx++)
				inputValues[ndx] = rnd.getUint32();
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_UNIFORM_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_UNIFORM, valueIndex);

			gl.bindBuffer(GL_UNIFORM_BUFFER, *inputBuffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			{
				const BufferMemMap bufMap(gl, GL_UNIFORM_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < de::min(valueInfo.arraySize, (deUint32)inputValues.size()); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.uniformBlockBinding(program.getProgram(), blockIndex, 0);
			gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());
			for (deUint32 ndx = 0; ndx < valueInfo.arraySize; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*ndx));
				const deUint32	ref		= ~inputValues[ndx];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(ndx) + "]");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}